

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastEr0S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  char *pcVar2;
  ushort *puVar3;
  uint *puVar4;
  
  if ((data.field_0._0_1_ != '\0') || (data.field_0._3_1_ < (byte)ptr[1])) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  puVar4 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 3) != 0) {
LAB_00154163:
    AlignFail(puVar4);
  }
  *puVar4 = (uint)(byte)ptr[1];
  puVar3 = (ushort *)(ptr + 2);
  if (puVar3 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar1 = (uint)table->fast_idx_mask & (uint)*puVar3;
    if ((uVar1 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar4 & 3) != 0) goto LAB_00154163;
    *puVar4 = *puVar4 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
  }
  return (char *)puVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr0S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnumSmallRange<uint8_t, 0>(
      PROTOBUF_TC_PARAM_PASS);
}